

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::PrintToChar<signed_char>(char value,iu_ostream *os)

{
  ostream *poVar1;
  string local_68;
  char local_46 [8];
  char str [2];
  string local_38;
  iu_ostream *local_18;
  iu_ostream *os_local;
  char value_local;
  
  local_18 = os;
  os_local._7_1_ = value;
  if (value == '\0') {
    std::operator<<(os,"\\0");
  }
  else if (value < ' ') {
    poVar1 = std::operator<<(os,"0x");
    ToHexString<signed_char>(&local_38,os_local._7_1_);
    std::operator<<(poVar1,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    local_46[1] = 0;
    local_46[0] = value;
    poVar1 = std::operator<<(os,"\'");
    ShowAnyCString<signed_char>(&local_68,local_46);
    poVar1 = std::operator<<(poVar1,(string *)&local_68);
    std::operator<<(poVar1,"\'");
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void PrintToChar(const T value, iu_ostream* os)
{
    // char or unsigned char の時に、 0 が NULL 文字にならないように修正
    if( value == 0 )
    {
        *os << "\\0";
    }
    else if( static_cast<int>(value) < 0x20 )
    {
        *os << "0x" << ToHexString(value);
    }
    else
    {
        const T str[2] = { value, 0 };
        *os << "\'" << detail::ShowAnyCString(str) << "\'";
    }
}